

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O2

DdNode * Cudd_addMatrixMultiply(DdManager *dd,DdNode *A,DdNode *B,DdNode **z,int nz)

{
  uint uVar1;
  int *vars;
  ulong uVar2;
  DdNode *pDVar3;
  ulong uVar4;
  
  uVar1 = dd->size;
  vars = (int *)malloc((long)(int)uVar1 * 4);
  if (vars == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    pDVar3 = (DdNode *)0x0;
  }
  else {
    uVar2 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      vars[uVar2] = 0;
    }
    uVar2 = 0;
    uVar4 = (ulong)(uint)nz;
    if (nz < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      vars[z[uVar2]->index] = 1;
    }
    do {
      dd->reordered = 0;
      pDVar3 = addMMRecur(dd,A,B,-1,vars);
    } while (dd->reordered == 1);
    free(vars);
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_addMatrixMultiply(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  DdNode ** z,
  int  nz)
{
    int i, nvars, *vars;
    DdNode *res; 

    /* Array vars says what variables are "summation" variables. */
    nvars = dd->size;
    vars = ABC_ALLOC(int,nvars);
    if (vars == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < nvars; i++) {
        vars[i] = 0;
    }
    for (i = 0; i < nz; i++) {
        vars[z[i]->index] = 1;
    }

    do {
        dd->reordered = 0;
        res = addMMRecur(dd,A,B,-1,vars);
    } while (dd->reordered == 1);
    ABC_FREE(vars);
    return(res);

}